

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O2

HANDLE PAL_RemoteHandleToLocal(RHANDLE rhRemote)

{
  PAL_ERROR PVar1;
  CPalThread *pthr;
  PAL_ERROR *pPVar2;
  HANDLE local_20;
  HANDLE hLocal;
  
  local_20 = (HANDLE)0xffffffffffffffff;
  if (PAL_InitializeChakraCoreCalled) {
    pthr = CorUnix::InternalGetCurrentThread();
    PVar1 = CorUnix::CSharedMemoryObjectManager::ConvertRemoteHandleToLocal
                      (CorUnix::g_pObjectManager,pthr,rhRemote,&local_20);
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return local_20;
    }
  }
  abort();
}

Assistant:

PALIMPORT
HANDLE
PALAPI
PAL_RemoteHandleToLocal(IN RHANDLE rhRemote)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr;
    HANDLE hLocal = INVALID_HANDLE_VALUE;

    PERF_ENTRY(PAL_RemoteHandleToLocal);
    ENTRY("PAL_RemoteHandleToLocal( hRemote=0x%lx )\n", rhRemote);

    pthr = InternalGetCurrentThread();

    palError = static_cast<CSharedMemoryObjectManager*>(g_pObjectManager)->ConvertRemoteHandleToLocal(
        pthr,
        rhRemote,
        &hLocal
        );

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }
    
    LOGEXIT("PAL_RemoteHandleToLocal returns HANDLE 0x%lx\n", hLocal);
    PERF_EXIT(PAL_RemoteHandleToLocal);
    return hLocal;
}